

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

QString * __thiscall
CPP::WriteInitialization::writeStringListProperty
          (QString *__return_storage_ptr__,WriteInitialization *this,DomStringList *list)

{
  bool bVar1;
  Language LVar2;
  QTextStream *pQVar3;
  qsizetype i;
  ulong uVar4;
  QString *value;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  char local_b1;
  QString local_a8;
  QString local_90;
  QString local_78;
  QArrayDataPointer<QString> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_48,__return_storage_ptr__,3);
  LVar2 = language::language();
  if (LVar2 == Python) {
    QTextStream::operator<<((QTextStream *)&local_48,'[');
    local_b1 = ']';
  }
  else if (LVar2 == Cpp) {
    local_b1 = '}';
    QTextStream::operator<<((QTextStream *)&local_48,"QStringList{");
  }
  else {
    local_b1 = '}';
  }
  local_60.d = (list->m_string).d.d;
  local_60.ptr = (list->m_string).d.ptr;
  uVar6 = (list->m_string).d.size;
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_60.size = uVar6;
  if (uVar6 == 0) goto LAB_0012c7ce;
  bVar1 = needsTranslation<DomStringList>(list);
  if (!bVar1) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      value = local_60.ptr;
      if (uVar4 != 0) {
        QTextStream::operator<<((QTextStream *)&local_48,", ");
        value = (QString *)((long)&((local_60.ptr)->d).d + lVar5);
      }
      language::_formatString((QTextStream *)&local_48,value,&this->m_dindent,true);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < uVar6);
    goto LAB_0012c7ce;
  }
  local_78.d.d = (list->m_attr_comment).d.d;
  local_78.d.ptr = (list->m_attr_comment).d.ptr;
  local_78.d.size = (list->m_attr_comment).d.size;
  if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) {
LAB_0012c680:
    lVar5 = 0;
    do {
      pQVar3 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_48,'\n');
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&this->m_indent);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    ");
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char16_t *)0x0;
      local_a8.d.size = 0;
      trCall(&local_90,this,(QString *)((long)&((local_60.ptr)->d).d + lVar5),&local_78,&local_a8);
      QTextStream::operator<<(pQVar3,&local_90);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (uVar6 != 1) {
        QTextStream::operator<<((QTextStream *)&local_48,',');
      }
      lVar5 = lVar5 + 0x18;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  else {
    LOCK();
    (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    uVar6 = local_60.size;
    if (local_60.size != 0) goto LAB_0012c680;
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0012c7ce:
  QTextStream::operator<<((QTextStream *)&local_48,local_b1);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
  QTextStream::~QTextStream((QTextStream *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString WriteInitialization::writeStringListProperty(const DomStringList *list) const
{
    QString propertyValue;
    QTextStream str(&propertyValue);
    char trailingDelimiter = '}';
    switch (language::language()) {
     case Language::Cpp:
        str << "QStringList{";
        break;
    case Language::Python:
       str << '[';
       trailingDelimiter = ']';
       break;
    }
    const QStringList values = list->elementString();
    if (!values.isEmpty()) {
        if (needsTranslation(list)) {
            const QString comment = list->attributeComment();
            const qsizetype last = values.size() - 1;
            for (qsizetype i = 0; i <= last; ++i) {
                str << '\n' << m_indent << "    " << trCall(values.at(i), comment);
                if (i != last)
                    str << ',';
            }
        } else {
            for (qsizetype i = 0; i < values.size(); ++i) {
                if (i)
                    str << ", ";
                str << language::qstring(values.at(i), m_dindent);
            }
        }
    }
    str << trailingDelimiter;
    return propertyValue;
}